

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaPtr xmlSchemaParse(xmlSchemaParserCtxtPtr ctxt)

{
  int iVar1;
  xmlSchemaConstructionCtxtPtr pxVar2;
  xmlSchemaBucketPtr_conflict pxStack_28;
  int res;
  xmlSchemaBucketPtr_conflict bucket;
  xmlSchemaPtr mainSchema;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  bucket = (xmlSchemaBucketPtr_conflict)0x0;
  pxStack_28 = (xmlSchemaBucketPtr_conflict)0x0;
  mainSchema = (xmlSchemaPtr)ctxt;
  xmlSchemaInitTypes();
  if (mainSchema == (xmlSchemaPtr)0x0) {
    return (xmlSchemaPtr)0x0;
  }
  *(undefined4 *)((long)&mainSchema->doc + 4) = 0;
  *(undefined4 *)&mainSchema->doc = 0;
  *(undefined4 *)&mainSchema->attrgrpDecl = 0;
  bucket = (xmlSchemaBucketPtr_conflict)xmlSchemaNewSchema((xmlSchemaParserCtxtPtr)mainSchema);
  if ((xmlSchemaPtr)bucket != (xmlSchemaPtr)0x0) {
    if (*(long *)&mainSchema->flags == 0) {
      pxVar2 = xmlSchemaConstructionCtxtCreate((xmlDictPtr)mainSchema->volatiles);
      *(xmlSchemaConstructionCtxtPtr *)&mainSchema->flags = pxVar2;
      if (*(long *)&mainSchema->flags == 0) {
        return (xmlSchemaPtr)0x0;
      }
      *(undefined4 *)&mainSchema->typeDecl = 1;
    }
    **(undefined8 **)&mainSchema->flags = bucket;
    iVar1 = xmlSchemaAddSchemaDoc
                      ((xmlSchemaParserCtxtPtr)mainSchema,0,(xmlChar *)mainSchema->elemDecl,
                       (xmlDocPtr)mainSchema->notaDecl,(char *)mainSchema->_private,
                       *(int *)&mainSchema->groupDecl,(xmlNodePtr)0x0,(xmlChar *)0x0,(xmlChar *)0x0,
                       &stack0xffffffffffffffd8);
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        if (pxStack_28 == (xmlSchemaBucketPtr_conflict)0x0) {
          if (mainSchema->elemDecl == (xmlHashTablePtr)0x0) {
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)mainSchema,XML_SCHEMAP_FAILED_LOAD,
                               (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                               "Failed to locate the main schema resource",(xmlChar *)0x0,
                               (xmlChar *)0x0);
          }
          else {
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)mainSchema,XML_SCHEMAP_FAILED_LOAD,
                               (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                               "Failed to locate the main schema resource at \'%s\'",
                               (xmlChar *)mainSchema->elemDecl,(xmlChar *)0x0);
          }
        }
        else {
          iVar1 = xmlSchemaParseNewDocWithContext
                            ((xmlSchemaParserCtxtPtr)mainSchema,(xmlSchemaPtr)bucket,pxStack_28);
          if (iVar1 == -1) goto LAB_0020d5e5;
          if (*(int *)((long)&mainSchema->doc + 4) == 0) {
            bucket->doc = pxStack_28->doc;
            bucket[1].imported = *(int *)&mainSchema->schemasImports;
            mainSchema->attrDecl = (xmlHashTablePtr)bucket;
            iVar1 = xmlSchemaFixupComponents
                              ((xmlSchemaParserCtxtPtr)mainSchema,
                               *(xmlSchemaBucketPtr_conflict *)(*(long *)&mainSchema->flags + 8));
            if (iVar1 == -1) goto LAB_0020d5e5;
          }
        }
      }
      if (*(int *)((long)&mainSchema->doc + 4) != 0) {
        if (bucket != (xmlSchemaBucketPtr_conflict)0x0) {
          xmlSchemaFree((xmlSchemaPtr)bucket);
          bucket = (xmlSchemaBucketPtr_conflict)0x0;
        }
        if (*(long *)&mainSchema->flags != 0) {
          xmlSchemaConstructionCtxtFree(*(xmlSchemaConstructionCtxtPtr *)&mainSchema->flags);
          *(undefined8 *)&mainSchema->flags = 0;
          *(undefined4 *)&mainSchema->typeDecl = 0;
        }
      }
      mainSchema->attrDecl = (xmlHashTablePtr)0x0;
      return (xmlSchemaPtr)bucket;
    }
  }
LAB_0020d5e5:
  if (bucket != (xmlSchemaBucketPtr_conflict)0x0) {
    xmlSchemaFree((xmlSchemaPtr)bucket);
    bucket = (xmlSchemaBucketPtr_conflict)0x0;
  }
  if (*(long *)&mainSchema->flags != 0) {
    xmlSchemaConstructionCtxtFree(*(xmlSchemaConstructionCtxtPtr *)&mainSchema->flags);
    *(undefined8 *)&mainSchema->flags = 0;
    *(undefined4 *)&mainSchema->typeDecl = 0;
  }
  xmlSchemaInternalErr
            ((xmlSchemaAbstractCtxtPtr)mainSchema,"xmlSchemaParse","An internal error occurred");
  mainSchema->attrDecl = (xmlHashTablePtr)0x0;
  return (xmlSchemaPtr)0x0;
}

Assistant:

xmlSchemaPtr
xmlSchemaParse(xmlSchemaParserCtxtPtr ctxt)
{
    xmlSchemaPtr mainSchema = NULL;
    xmlSchemaBucketPtr bucket = NULL;
    int res;

    /*
    * This one is used if the schema to be parsed was specified via
    * the API; i.e. not automatically by the validated instance document.
    */

    xmlSchemaInitTypes();

    if (ctxt == NULL)
        return (NULL);

    /* TODO: Init the context. Is this all we need?*/
    ctxt->nberrors = 0;
    ctxt->err = 0;
    ctxt->counter = 0;

    /* Create the *main* schema. */
    mainSchema = xmlSchemaNewSchema(ctxt);
    if (mainSchema == NULL)
	goto exit_failure;
    /*
    * Create the schema constructor.
    */
    if (ctxt->constructor == NULL) {
	ctxt->constructor = xmlSchemaConstructionCtxtCreate(ctxt->dict);
	if (ctxt->constructor == NULL)
	    return(NULL);
	/* Take ownership of the constructor to be able to free it. */
	ctxt->ownsConstructor = 1;
    }
    ctxt->constructor->mainSchema = mainSchema;
    /*
    * Locate and add the schema document.
    */
    res = xmlSchemaAddSchemaDoc(ctxt, XML_SCHEMA_SCHEMA_MAIN,
	ctxt->URL, ctxt->doc, ctxt->buffer, ctxt->size, NULL,
	NULL, NULL, &bucket);
    if (res == -1)
	goto exit_failure;
    if (res != 0)
	goto exit;

    if (bucket == NULL) {
	/* TODO: Error code, actually we failed to *locate* the schema. */
	if (ctxt->URL)
	    xmlSchemaCustomErr(ACTXT_CAST ctxt, XML_SCHEMAP_FAILED_LOAD,
		NULL, NULL,
		"Failed to locate the main schema resource at '%s'",
		ctxt->URL, NULL);
	else
	    xmlSchemaCustomErr(ACTXT_CAST ctxt, XML_SCHEMAP_FAILED_LOAD,
		NULL, NULL,
		"Failed to locate the main schema resource",
		    NULL, NULL);
	goto exit;
    }
    /* Then do the parsing for good. */
    if (xmlSchemaParseNewDocWithContext(ctxt, mainSchema, bucket) == -1)
	goto exit_failure;
    if (ctxt->nberrors != 0)
	goto exit;

    mainSchema->doc = bucket->doc;
    mainSchema->preserve = ctxt->preserve;

    ctxt->schema = mainSchema;

    if (xmlSchemaFixupComponents(ctxt, WXS_CONSTRUCTOR(ctxt)->mainBucket) == -1)
	goto exit_failure;

    /*
    * TODO: This is not nice, since we cannot distinguish from the
    * result if there was an internal error or not.
    */
exit:
    if (ctxt->nberrors != 0) {
	if (mainSchema) {
	    xmlSchemaFree(mainSchema);
	    mainSchema = NULL;
	}
	if (ctxt->constructor) {
	    xmlSchemaConstructionCtxtFree(ctxt->constructor);
	    ctxt->constructor = NULL;
	    ctxt->ownsConstructor = 0;
	}
    }
    ctxt->schema = NULL;
    return(mainSchema);
exit_failure:
    /*
    * Quite verbose, but should catch internal errors, which were
    * not communicated.
    */
    if (mainSchema) {
        xmlSchemaFree(mainSchema);
	mainSchema = NULL;
    }
    if (ctxt->constructor) {
	xmlSchemaConstructionCtxtFree(ctxt->constructor);
	ctxt->constructor = NULL;
	ctxt->ownsConstructor = 0;
    }
    PERROR_INT2("xmlSchemaParse",
	"An internal error occurred");
    ctxt->schema = NULL;
    return(NULL);
}